

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpd.cpp
# Opt level: O2

void __thiscall xmrig::Httpd::onHttpData(Httpd *this,HttpData *data)

{
  bool bVar1;
  int iVar2;
  Api *this_00;
  Config *pCVar3;
  size_type sVar4;
  mapped_type *__lhs;
  allocator local_e2;
  allocator local_e1;
  HttpApiResponse local_e0;
  key_type local_40;
  
  iVar2 = data->method;
  if (iVar2 == 1) {
    bVar1 = std::operator==(&data->url,"/favicon.ico");
    if (bVar1) {
      HttpResponse::HttpResponse(&local_e0.super_HttpResponse,data->m_id,0x194);
      HttpResponse::end(&local_e0.super_HttpResponse,(char *)0x0,0);
      std::
      _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_e0.super_HttpResponse.m_headers._M_t);
      return;
    }
    iVar2 = data->method;
  }
  else if (iVar2 == 6) {
    HttpApiResponse::HttpApiResponse(&local_e0,data->m_id);
    HttpApiResponse::end(&local_e0);
    goto LAB_0015e092;
  }
  if (iVar2 < 5) {
    iVar2 = auth(this,data);
    if (iVar2 == 200) {
      if (data->method == 1) {
LAB_0015e061:
        this_00 = Base::api(this->m_base);
        Api::request(this_00,data);
        return;
      }
      pCVar3 = Base::config(this->m_base);
      if ((pCVar3->super_BaseConfig).m_http.m_restricted == true) {
        HttpApiResponse::HttpApiResponse(&local_e0,data->m_id,0x193);
        HttpApiResponse::end(&local_e0);
      }
      else {
        std::__cxx11::string::string((string *)&local_e0,"content-type",&local_e1);
        sVar4 = std::
                map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::count(&data->headers,(key_type *)&local_e0);
        if (sVar4 == 0) {
          std::__cxx11::string::~string((string *)&local_e0);
        }
        else {
          std::__cxx11::string::string((string *)&local_40,"content-type",&local_e2);
          __lhs = std::
                  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&data->headers,&local_40);
          bVar1 = std::operator!=(__lhs,"application/json");
          std::__cxx11::string::~string((string *)&local_40);
          std::__cxx11::string::~string((string *)&local_e0);
          if (!bVar1) goto LAB_0015e061;
        }
        HttpApiResponse::HttpApiResponse(&local_e0,data->m_id,0x19f);
        HttpApiResponse::end(&local_e0);
      }
    }
    else {
      HttpApiResponse::HttpApiResponse(&local_e0,data->m_id,iVar2);
      HttpApiResponse::end(&local_e0);
    }
  }
  else {
    HttpApiResponse::HttpApiResponse(&local_e0,data->m_id,0x195);
    HttpApiResponse::end(&local_e0);
  }
LAB_0015e092:
  HttpApiResponse::~HttpApiResponse(&local_e0);
  return;
}

Assistant:

void xmrig::Httpd::onHttpData(const HttpData &data)
{
    if (data.method == HTTP_OPTIONS) {
        return HttpApiResponse(data.id()).end();
    }

    if (data.method == HTTP_GET && data.url == "/favicon.ico") {
#       ifdef _WIN32
        if (favicon != nullptr) {
            HttpResponse response(data.id());
            response.setHeader("Content-Type", "image/x-icon");

            return response.end(favicon, faviconSize);
        }
#       endif

        return HttpResponse(data.id(), 404).end();
    }

    if (data.method > 4) {
        return HttpApiResponse(data.id(), HTTP_STATUS_METHOD_NOT_ALLOWED).end();
    }

    const int status = auth(data);
    if (status != HTTP_STATUS_OK) {
        return HttpApiResponse(data.id(), status).end();
    }

    if (data.method != HTTP_GET) {
        if (m_base->config()->http().isRestricted()) {
            return HttpApiResponse(data.id(), HTTP_STATUS_FORBIDDEN).end();
        }

        if (!data.headers.count(kContentType) || data.headers.at(kContentType) != "application/json") {
            return HttpApiResponse(data.id(), HTTP_STATUS_UNSUPPORTED_MEDIA_TYPE).end();
        }
    }

    m_base->api()->request(data);
}